

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O2

void CMconn_fail_conditions(CMConnection conn)

{
  CMControlList p_Var1;
  CMControlList extraout_RDX;
  CMControlList cl;
  CMControlList extraout_RDX_00;
  CMCondition cond;
  
  p_Var1 = conn->cm->control_list;
  set_debug_flag(conn->cm);
  cond = (CMCondition)&p_Var1->condition_list;
  cl = extraout_RDX;
  while (cond = cond->next, cond != (CMCondition)0x0) {
    if (cond->conn == conn) {
      cond->failed = 1;
      CMCondition_trigger(conn->cm,cond,cl);
      cl = extraout_RDX_00;
    }
  }
  if (p_Var1->cond_polling != 0) {
    CMwake_server_thread(conn->cm);
    return;
  }
  return;
}

Assistant:

extern void
CMconn_fail_conditions(CMConnection conn)
{
    CMControlList cl = conn->cm->control_list;
    CMCondition cond_list;
    set_debug_flag(conn->cm);
    cond_list = cl->condition_list;
    while(cond_list != NULL) {
	if (cond_list->conn == conn) {
	    cond_list->failed = 1;
	    CMCondition_trigger(conn->cm, cond_list, cl);
	}
	cond_list = cond_list->next;
    }
    if (cl->cond_polling) {
	/* wake the server thread in case we're not him */
	CMwake_server_thread(conn->cm);
    }
}